

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O3

mp_int * mp_from_integer(uintmax_t n)

{
  size_t sVar1;
  BignumInt *pBVar2;
  undefined1 auVar3 [16];
  mp_int *pmVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  pmVar4 = (mp_int *)safemalloc(1,0x10,8);
  pmVar4->nw = 1;
  pmVar4->w = &pmVar4[1].nw;
  smemclr(pmVar4 + 1,8);
  auVar3 = _DAT_00182df0;
  sVar1 = pmVar4->nw;
  if (sVar1 != 0) {
    pBVar2 = pmVar4->w;
    lVar5 = sVar1 - 1;
    auVar7._8_4_ = (int)lVar5;
    auVar7._0_8_ = lVar5;
    auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar7 = auVar7 ^ _DAT_00182df0;
    auVar8 = _DAT_00180bd0;
    do {
      auVar9 = auVar8 ^ auVar3;
      if ((bool)(~(auVar9._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar9._0_4_ ||
                  auVar7._4_4_ < auVar9._4_4_) & 1)) {
        pBVar2[uVar6] = n;
      }
      if ((auVar9._12_4_ != auVar7._12_4_ || auVar9._8_4_ <= auVar7._8_4_) &&
          auVar9._12_4_ <= auVar7._12_4_) {
        pBVar2[uVar6 + 1] = n;
      }
      uVar6 = uVar6 + 2;
      lVar5 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 2;
      auVar8._8_8_ = lVar5 + 2;
    } while ((sVar1 + 1 & 0xfffffffffffffffe) != uVar6);
  }
  return pmVar4;
}

Assistant:

mp_int *mp_from_integer(uintmax_t n)
{
    mp_int *x = mp_make_sized(
        (sizeof(n) + BIGNUM_INT_BYTES - 1) / BIGNUM_INT_BYTES);
    for (size_t i = 0; i < x->nw; i++)
        x->w[i] = n >> (i * BIGNUM_INT_BITS);
    return x;
}